

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O1

void __thiscall Pl_Flate::Members::Members(Members *this,size_t out_bufsize,action_e action)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  undefined8 *puVar3;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->out_bufsize = out_bufsize;
  this->action = action;
  this->initialized = false;
  this->zdata = (void *)0x0;
  this->written = 0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  (this->zopfli_buf)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  peVar2 = (element_type *)operator_new__(out_bufsize);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,std::default_delete<unsigned_char[]>,std::allocator<void>,void>
            (&_Stack_20,peVar2);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  puVar3 = (undefined8 *)operator_new(0x70);
  this->zdata = puVar3;
  if (out_bufsize >> 0x20 == 0) {
    *puVar3 = 0;
    *(undefined4 *)(puVar3 + 1) = 0;
    puVar3[8] = 0;
    puVar3[9] = 0;
    puVar3[10] = 0;
    puVar3[3] = (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(int *)(puVar3 + 4) = (int)out_bufsize;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"Pl_Flate: zlib doesn\'t support buffer sizes larger than unsigned int");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Pl_Flate::Members::Members(size_t out_bufsize, action_e action) :
    out_bufsize(out_bufsize),
    action(action),
    initialized(false),
    zdata(nullptr)
{
    this->outbuf = QUtil::make_shared_array<unsigned char>(out_bufsize);
    // Indirect through zdata to reach the z_stream so we don't have to include zlib.h in
    // Pl_Flate.hh.  This means people using shared library versions of qpdf don't have to have zlib
    // development files available, which particularly helps in a Windows environment.
    this->zdata = new z_stream;

    if (out_bufsize > UINT_MAX) {
        throw std::runtime_error(
            "Pl_Flate: zlib doesn't support buffer sizes larger than unsigned int");
    }

    z_stream& zstream = *(static_cast<z_stream*>(this->zdata));
    zstream.zalloc = nullptr;
    zstream.zfree = nullptr;
    zstream.opaque = nullptr;
    zstream.next_in = nullptr;
    zstream.avail_in = 0;
    zstream.next_out = this->outbuf.get();
    zstream.avail_out = QIntC::to_uint(out_bufsize);

    if (action == a_deflate && Pl_Flate::zopfli_enabled()) {
        zopfli_buf = std::make_unique<std::string>();
    }
}